

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strfuncs.c
# Opt level: O1

int32 str2words(char *line,char **ptr,int32 max_ptr)

{
  int iVar1;
  long lVar2;
  byte *pbVar3;
  uint uVar4;
  char *pcVar5;
  uint uVar6;
  long lVar7;
  long lVar8;
  byte bVar9;
  long lVar10;
  bool bVar11;
  
  bVar9 = *line;
  bVar11 = bVar9 == 0;
  if (bVar11) {
    iVar1 = 0;
  }
  else {
    lVar2 = 0;
    lVar8 = 0;
    iVar1 = 0;
    uVar4 = 0;
    do {
      lVar7 = (long)(int)uVar4;
      lVar10 = lVar7 << 0x20;
      pbVar3 = (byte *)(line + lVar7 + 1);
      uVar6 = uVar4;
      while ((uVar6 = uVar6 + 1, bVar9 < 0x21 && ((0x100002600U >> ((ulong)bVar9 & 0x3f) & 1) != 0))
            ) {
        bVar9 = line[lVar7 + 1];
        lVar8 = lVar7 + 1;
        uVar4 = uVar4 + 1;
        lVar10 = lVar10 + 0x100000000;
        pbVar3 = pbVar3 + 1;
        bVar11 = bVar9 == 0;
        lVar7 = lVar8;
        if (bVar11) goto LAB_00106f69;
      }
      if (bVar11) {
LAB_00106f69:
        return (int32)lVar2;
      }
      if (max_ptr <= lVar2 && ptr != (char **)0x0) {
        if (lVar7 < 0) {
          return -1;
        }
        iVar1 = uVar4 + 1;
        pcVar5 = line + uVar4;
        do {
          if (*pcVar5 == '\0') {
            *pcVar5 = ' ';
          }
          iVar1 = iVar1 + -1;
          pcVar5 = pcVar5 + -1;
        } while (0 < iVar1);
        return -1;
      }
      if (ptr != (char **)0x0) {
        ptr[lVar2] = line + lVar8;
      }
      iVar1 = iVar1 + 1;
      bVar9 = line[lVar10 >> 0x20];
      bVar11 = bVar9 == 0;
      if (bVar11) {
        return iVar1;
      }
      lVar2 = lVar2 + 1;
      uVar4 = uVar6;
      while ((0x20 < bVar9 || ((0x100002600U >> ((ulong)bVar9 & 0x3f) & 1) == 0))) {
        bVar9 = *pbVar3;
        pbVar3 = pbVar3 + 1;
        uVar4 = uVar4 + 1;
        bVar11 = bVar9 == 0;
        if (bVar11) goto LAB_00106f69;
      }
      if (bVar11) {
        return iVar1;
      }
      if (ptr != (char **)0x0) {
        pbVar3[-1] = 0;
      }
      lVar8 = (long)(int)uVar4;
      bVar9 = line[lVar8];
      bVar11 = bVar9 == 0;
    } while (!bVar11);
  }
  return iVar1;
}

Assistant:

int32
str2words(char *line, char **ptr, int32 max_ptr)
{
    int32 i, n;

    n = 0;                      /* #words found so far */
    i = 0;                      /* For scanning through the input string */
    while (1) {
        /* Skip whitespace before next word */
        while (line[i] && isspace_c(line[i]))
            ++i;
        if (!line[i])
            break;

        if (ptr != NULL && n >= max_ptr) {
            /*
             * Pointer array size insufficient.  Restore NULL chars inserted so far
             * to space chars.  Not a perfect restoration, but better than nothing.
             */
            for (; i >= 0; --i)
                if (line[i] == '\0')
                    line[i] = ' ';

            return -1;
        }

        /* Scan to end of word */
        if (ptr != NULL)
            ptr[n] = line + i;
        ++n;
        while (line[i] && !isspace_c(line[i]))
            ++i;
        if (!line[i])
            break;
        if (ptr != NULL)
            line[i] = '\0';
        ++i;
    }

    return n;
}